

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)

{
  uint uVar1;
  unqlite_kv_io *puVar2;
  uchar *buf;
  uchar *zRaw;
  uint *puVar3;
  int iVar4;
  sxu32 sVar5;
  undefined4 uVar6;
  unqlite_page *pHeader;
  unqlite_page *local_38;
  sxu32 nHash;
  
  puVar2 = pEngine->pIo;
  if (dbSize == 0) {
    iVar4 = (*puVar2->xNew)(puVar2->pHandle,&pHeader);
    if ((iVar4 == 0) && (iVar4 = (*pEngine->pIo->xWrite)(pHeader), iVar4 == 0)) {
      puVar3 = (uint *)pHeader->zData;
      pEngine[0x1a].pIo = (unqlite_kv_io *)pHeader;
      uVar1 = *(uint *)&pEngine[0x27].pIo;
      *puVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar6 = (*(code *)pEngine[0x18].pIo)("chm@symisc",10);
      *(ushort *)((long)puVar3 + 6) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      *(char *)((long)puVar3 + 5) = (char)((uint)uVar6 >> 0x10);
      *(char *)(puVar3 + 1) = (char)((uint)uVar6 >> 0x18);
      puVar3[2] = 0;
      puVar3[3] = 0;
      SyBigEndianPack64((uchar *)(puVar3 + 4),(sxu64)pEngine[0x24].pIo);
      SyBigEndianPack64((uchar *)(puVar3 + 6),(sxu64)pEngine[0x25].pIo);
      pEngine[0x1f].pIo = (unqlite_kv_io *)pHeader->iPage;
      puVar3[10] = 0;
      puVar3[8] = 0;
      puVar3[9] = 0;
      *(short *)&pEngine[0x20].pIo = ((short)puVar3 - (short)*(undefined4 *)&pHeader->zData) + 0x2c;
LAB_00111279:
      iVar4 = 0;
    }
  }
  else {
    iVar4 = (*puVar2->xGet)(puVar2->pHandle,1,&pHeader);
    if (iVar4 == 0) {
      buf = pHeader->zData;
      pEngine[0x1a].pIo = (unqlite_kv_io *)pHeader;
      SyBigEndianUnpack32(buf,(sxu32 *)(pEngine + 0x27));
      if (*(int *)&pEngine[0x27].pIo == -0x587d235) {
        SyBigEndianUnpack32(buf + 4,&nHash);
        sVar5 = (*(code *)pEngine[0x18].pIo)("chm@symisc",10);
        if (sVar5 == nHash) {
          SyBigEndianUnpack64(buf + 8,(sxu64 *)(pEngine + 0x23));
          SyBigEndianUnpack64(buf + 0x10,(sxu64 *)(pEngine + 0x24));
          SyBigEndianUnpack64(buf + 0x18,(sxu64 *)(pEngine + 0x25));
          pEngine[0x26].pIo = (unqlite_kv_io *)((long)pEngine[0x25].pIo * 2);
          pEngine[0x1f].pIo = (unqlite_kv_io *)pHeader->iPage;
          SyBigEndianUnpack64(buf + 0x20,(sxu64 *)(pEngine + 0x21));
          SyBigEndianUnpack32(buf + 0x28,(sxu32 *)((long)&pEngine[0x20].pIo + 4));
          zRaw = pHeader->zData;
          *(short *)&pEngine[0x20].pIo = ((short)buf - (short)zRaw) + 0x2c;
          iVar4 = lhMapLoadPage((lhash_kv_engine *)pEngine,(lhash_bmap_page *)(pEngine + 0x1f),zRaw)
          ;
          if (iVar4 == 0) {
            do {
              puVar2 = pEngine[0x21].pIo;
              if (puVar2 == (unqlite_kv_io *)0x0) goto LAB_00111279;
              iVar4 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pgno)puVar2,&local_38);
              if (iVar4 != 0) {
                return iVar4;
              }
              pEngine[0x1f].pIo = puVar2;
              *(undefined2 *)&pEngine[0x20].pIo = 0;
              iVar4 = lhMapLoadPage((lhash_kv_engine *)pEngine,(lhash_bmap_page *)(pEngine + 0x1f),
                                    local_38->zData);
            } while (iVar4 == 0);
          }
        }
        else {
          (*pEngine->pIo->xErr)(pEngine->pIo->pHandle,"Invalid hash function");
          iVar4 = -9;
        }
      }
      else {
        iVar4 = -0x18;
      }
    }
  }
  return iVar4;
}

Assistant:

static int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	unqlite_page *pHeader;
	int rc;
	if( dbSize < 1 ){
		/* A new database, create the header */
		rc = pEngine->pIo->xNew(pEngine->pIo->pHandle,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a writer lock */
		rc = pEngine->pIo->xWrite(pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Write the hash header */
		rc = lhash_write_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}else{
		/* Acquire the page one of the database */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Read the database header */
		rc = lhash_read_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	return UNQLITE_OK;
}